

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O3

void __thiscall MinVR::VRSearchPlugin::VRSearchPlugin(VRSearchPlugin *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_40;
  
  plVar1 = &(this->super_VRSearchPath)._searchPath;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_VRSearchPath)._searchPath.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_VRSearchPath)._vptr_VRSearchPath = (_func_int **)&PTR__selectFile_00176850;
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"./","");
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"${MINVR_ROOT}/lib/MinVR-2.0/","");
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"${MINVR_ROOT}/bin/MinVR-2.0/","");
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/build_O3/install/lib/MinVR-2.0/"
             ,"");
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/build_O3/lib/","");
  VRSearchPath::addPathEntry(&this->super_VRSearchPath,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VRSearchPlugin::VRSearchPlugin() {

  // 1. already added externally

  // 2. current working directory
  addPathEntry("./", false);

  // 3. installation pointed to by the $MINVR_ROOT$ envvar
  addPathEntry("${MINVR_ROOT}/lib/MinVR" MINVR_VERSION_STR "/", false);
  addPathEntry("${MINVR_ROOT}/bin/MinVR" MINVR_VERSION_STR "/", false);

  // 4. installation prefix #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_INSTALL_PLUGIN_DIR "/", false);

  // 5. build directory #defined in VRConfig.h (set by cmake)
  addPathEntry(MINVR_BUILD_PLUGIN_DIR "/", false);
}